

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_code_options.c
# Opt level: O0

int check_uncompressed(test_state *state)

{
  ulong uVar1;
  long in_RDI;
  uchar *tmp;
  int size;
  int status;
  int iVar2;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  iVar2 = *(int *)(in_RDI + 0xc);
  for (uVar1 = *(ulong *)(in_RDI + 0x10);
      uVar1 < (ulong)(*(long *)(in_RDI + 0x10) + *(long *)(in_RDI + 0x30));
      uVar1 = uVar1 + (long)(iVar2 << 1)) {
    (**(code **)(in_RDI + 0x50))(uVar1,*(undefined8 *)(in_RDI + 0x40),iVar2);
    (**(code **)(in_RDI + 0x50))(uVar1 + (long)iVar2,*(undefined8 *)(in_RDI + 0x48),iVar2);
  }
  printf("Checking uncompressed ... ");
  local_4 = check_block_sizes((test_state *)CONCAT44(in_stack_ffffffffffffffec,iVar2),
                              (int)(uVar1 >> 0x20),(int)uVar1);
  if (local_4 == 0) {
    printf("%s\n","\x1b[0;32mPASS\x1b[0m");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int check_uncompressed(struct test_state *state)
{
    int status, size;
    unsigned char *tmp;

    size = state->bytes_per_sample;

    for (tmp = state->ubuf;
         tmp < state->ubuf + state->buf_len;
         tmp += 2 * size) {
        state->out(tmp, state->xmax, size);
        state->out(tmp + size, state->xmin, size);
    }

    printf("Checking uncompressed ... ");
    status = check_block_sizes(state,
                               (1ULL << state->id_len) - 1,
                               state->id_len);
    if (status)
        return status;

    printf ("%s\n", CHECK_PASS);
    return 0;
}